

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O3

ostream * std::operator<<(ostream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  
  if ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar2 = "[]";
    lVar1 = 2;
  }
  else {
    uVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    if (8 < (ulong)((long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start)) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)(v->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(v->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pcVar2 = "]";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}